

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O0

void pfx_table_free(pfx_table *pfx_table)

{
  uint *puVar1;
  trie_node *ptr;
  long in_FS_OFFSET;
  trie_node *local_70;
  uint local_64;
  uint j;
  node_data *data;
  trie_node *rm_node;
  trie_node *root;
  int i;
  pfx_table *pfx_table_local;
  pfx_record record;
  
  record.socket = *(rtr_socket **)(in_FS_OFFSET + 0x28);
  root._4_4_ = 0;
  do {
    if (1 < root._4_4_) {
      pthread_rwlock_destroy((pthread_rwlock_t *)&pfx_table->lock);
      if (*(rtr_socket **)(in_FS_OFFSET + 0x28) == record.socket) {
        return;
      }
      __stack_chk_fail();
    }
    if (root._4_4_ == 0) {
      local_70 = pfx_table->ipv4;
    }
    else {
      local_70 = pfx_table->ipv6;
    }
    if (local_70 != (trie_node *)0x0) {
      pthread_rwlock_wrlock((pthread_rwlock_t *)&pfx_table->lock);
      do {
        puVar1 = (uint *)local_70->data;
        for (local_64 = 0; local_64 < *puVar1; local_64 = local_64 + 1) {
          pfx_table_local._0_4_ = *(undefined4 *)(*(long *)(puVar1 + 2) + (ulong)local_64 * 0x10);
          unique0x00012000 = *(undefined8 *)&local_70->prefix;
          record.prefix._0_8_ = *(undefined8 *)((long)&(local_70->prefix).u + 4);
          record.prefix.u.addr6.addr[1] = (local_70->prefix).u.addr6.addr[3];
          record.prefix.u.addr6.addr[2]._0_1_ = local_70->len;
          record.prefix.u.addr6.addr[2]._1_1_ =
               *(undefined1 *)(*(long *)(puVar1 + 2) + (ulong)local_64 * 0x10 + 4);
          record._24_8_ = *(undefined8 *)(*(long *)(puVar1 + 2) + (ulong)local_64 * 0x10 + 8);
          pfx_table_notify_clients(pfx_table,(pfx_record *)&pfx_table_local,false);
        }
        ptr = trie_remove(local_70,&local_70->prefix,local_70->len,0);
        if (ptr == (trie_node *)0x0) {
          __assert_fail("rm_node",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/pfx/trie/trie-pfx.c"
                        ,99,"void pfx_table_free(struct pfx_table *)");
        }
        lrtr_free(*(void **)((long)ptr->data + 8));
        lrtr_free(ptr->data);
        lrtr_free(ptr);
      } while (ptr != local_70);
      if (root._4_4_ == 0) {
        pfx_table->ipv4 = (trie_node *)0x0;
      }
      else {
        pfx_table->ipv6 = (trie_node *)0x0;
      }
      pthread_rwlock_unlock((pthread_rwlock_t *)&pfx_table->lock);
    }
    root._4_4_ = root._4_4_ + 1;
  } while( true );
}

Assistant:

RTRLIB_EXPORT void pfx_table_free(struct pfx_table *pfx_table)
{
	for (int i = 0; i < 2; i++) {
		struct trie_node *root = (i == 0 ? pfx_table->ipv4 : pfx_table->ipv6);

		if (root) {
			struct trie_node *rm_node;

			pthread_rwlock_wrlock(&(pfx_table->lock));
			do {
				struct node_data *data = (struct node_data *)(root->data);

				for (unsigned int j = 0; j < data->len; j++) {
					struct pfx_record record = {data->ary[j].asn, (root->prefix), root->len,
								    data->ary[j].max_len, data->ary[j].socket};
					pfx_table_notify_clients(pfx_table, &record, false);
				}
				rm_node = (trie_remove(root, &(root->prefix), root->len, 0));
				assert(rm_node);
				lrtr_free(((struct node_data *)rm_node->data)->ary);
				lrtr_free(rm_node->data);
				lrtr_free(rm_node);
			} while (rm_node != root);
			if (i == 0)
				pfx_table->ipv4 = NULL;
			else
				pfx_table->ipv6 = NULL;

			pthread_rwlock_unlock(&(pfx_table->lock));
		}
	}
	pthread_rwlock_destroy(&(pfx_table->lock));
}